

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateDependencyIncludes
          (FileGenerator *this,Printer *printer)

{
  int iVar1;
  size_t this_00;
  int iVar2;
  FileDescriptor *pFVar3;
  string *__x;
  size_type sVar4;
  char *pcVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  char *local_1b8;
  char *local_1a0;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  string local_a8;
  byte local_81;
  string *psStack_80;
  bool public_import;
  string *name;
  bool use_system_include;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  int i_1;
  undefined1 local_68;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  public_import_names;
  Printer *printer_local;
  FileGenerator *this_local;
  
  public_import_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_48);
  local_4c = 0;
  while( true ) {
    iVar1 = local_4c;
    iVar2 = FileDescriptor::public_dependency_count(this->file_);
    if (iVar2 <= iVar1) break;
    pFVar3 = FileDescriptor::public_dependency(this->file_,local_4c);
    __x = FileDescriptor::name_abi_cxx11_(pFVar3);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48,__x);
    _Stack_70 = pVar6.first._M_node;
    local_68 = pVar6.second;
    local_4c = local_4c + 1;
  }
  name._4_4_ = 0;
  while( true ) {
    iVar1 = name._4_4_;
    iVar2 = FileDescriptor::dependency_count(this->file_);
    if (iVar2 <= iVar1) break;
    pFVar3 = FileDescriptor::dependency(this->file_,name._4_4_);
    name._3_1_ = IsWellKnownMessage(pFVar3);
    pFVar3 = FileDescriptor::dependency(this->file_,name._4_4_);
    psStack_80 = FileDescriptor::name_abi_cxx11_(pFVar3);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_48,psStack_80);
    this_00 = public_import_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_81 = sVar4 != 0;
    StripProto(&local_a8,psStack_80);
    pcVar5 = "";
    if ((local_81 & 1) != 0) {
      pcVar5 = "  // IWYU pragma: export";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar5,&local_c9);
    if ((name._3_1_ & 1) == 0) {
      local_1a0 = "\"";
    }
    else {
      local_1a0 = "<";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,local_1a0,&local_f1);
    if ((name._3_1_ & 1) == 0) {
      local_1b8 = "\"";
    }
    else {
      local_1b8 = ">";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,local_1b8,&local_119);
    io::Printer::Print((Printer *)this_00,"#include $left$$dependency$.pb.h$right$$iwyu$\n",
                       "dependency",&local_a8,"iwyu",&local_c8,"left",&local_f0,"right",&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&local_a8);
    name._4_4_ = name._4_4_ + 1;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_48);
  return;
}

Assistant:

void FileGenerator::GenerateDependencyIncludes(io::Printer* printer) {
  std::set<string> public_import_names;
  for (int i = 0; i < file_->public_dependency_count(); i++) {
    public_import_names.insert(file_->public_dependency(i)->name());
  }

  for (int i = 0; i < file_->dependency_count(); i++) {
    const bool use_system_include = IsWellKnownMessage(file_->dependency(i));
    const string& name = file_->dependency(i)->name();
    bool public_import = (public_import_names.count(name) != 0);


    printer->Print(
      "#include $left$$dependency$.pb.h$right$$iwyu$\n",
      "dependency", StripProto(name),
      "iwyu", (public_import) ? "  // IWYU pragma: export" : "",
      "left", use_system_include ? "<" : "\"",
      "right", use_system_include ? ">" : "\"");
  }
}